

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

void duckdb::Node16::ShrinkNode48(ART *art,Node *node16,Node *node48)

{
  uint16_t i;
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *pBVar1;
  Node48 *pNVar2;
  long lVar3;
  byte bVar4;
  
  pBVar1 = BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::New(art,node16);
  pNVar2 = Node::Ref<duckdb::Node48>(art,(Node)(node48->super_IndexPointer).data,NODE_48);
  Node::SetGateStatus(node16,(GateStatus)((node48->super_IndexPointer).data >> 0x3f));
  pBVar1->count = '\0';
  bVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    if (pNVar2->child_index[lVar3] != '0') {
      pBVar1->key[bVar4] = (uint8_t)lVar3;
      pBVar1->children[bVar4].super_IndexPointer.data =
           pNVar2->children[pNVar2->child_index[lVar3]].super_IndexPointer.data;
      bVar4 = bVar4 + 1;
      pBVar1->count = bVar4;
    }
  }
  pNVar2->count = '\0';
  Node::Free(art,node48);
  return;
}

Assistant:

void Node16::ShrinkNode48(ART &art, Node &node16, Node &node48) {
	auto &n16 = New(art, node16);
	auto &n48 = Node::Ref<Node48>(art, node48, NType::NODE_48);
	node16.SetGateStatus(node48.GetGateStatus());

	n16.count = 0;
	for (uint16_t i = 0; i < Node256::CAPACITY; i++) {
		if (n48.child_index[i] != Node48::EMPTY_MARKER) {
			n16.key[n16.count] = UnsafeNumericCast<uint8_t>(i);
			n16.children[n16.count] = n48.children[n48.child_index[i]];
			n16.count++;
		}
	}

	n48.count = 0;
	Node::Free(art, node48);
}